

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:480:11)>
::getImpl(SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:480:11)>
          *this,ExceptionOrValue *output)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  String local_3d8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_3c0;
  uint local_3b4;
  DebugComparison<unsigned_int,_unsigned_long_&> _kjCondition;
  ExceptionOr<kj::String> local_388;
  ExceptionOr<unsigned_long> depResult;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    local_388.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.file;
    local_388.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1._32_8_;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = 0;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_388.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),0x105);
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0
    ;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         (Detail *)0x0;
    local_388.value.ptr.isSet = false;
    ExceptionOr<kj::String>::operator=((ExceptionOr<kj::String> *)output,&local_388);
    uVar4 = local_388.value.ptr.field_1.value.content.size_;
    uVar3 = local_388.value.ptr.field_1.value.content.ptr;
    if ((local_388.value.ptr.isSet == true) &&
       (local_388.value.ptr.field_1.value.content.ptr != (char *)0x0)) {
      local_388.value.ptr.field_1.value.content.ptr = (char *)0x0;
      local_388.value.ptr.field_1.value.content.size_ = 0;
      (**(local_388.value.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                (local_388.value.ptr.field_1.value.content.disposer,uVar3,1,uVar4,uVar4,0);
    }
    if (local_388.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_388.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
  }
  else if (depResult.value.ptr.isSet == true) {
    _kjCondition.right = (unsigned_long *)&local_3c0;
    _kjCondition.left = 3;
    _kjCondition.op.content.ptr = " == ";
    local_3c0 = depResult.value.ptr.field_1;
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = depResult.value.ptr.field_1.value == 3;
    if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
      local_3b4 = 3;
      Debug::
      log<char_const(&)[29],kj::_::DebugComparison<unsigned_int,unsigned_long&>&,unsigned_int,unsigned_long&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x1e1,ERROR,"\"failed: expected \" \"(3u) == (n)\", _kjCondition, 3u, n",
                 (char (*) [29])"failed: expected (3u) == (n)",&_kjCondition,&local_3b4,
                 _kjCondition.right);
    }
    heapString(&local_3d8,*(this->func).receiveBuffer2,local_3c0.value);
    local_388.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_388.value.ptr.isSet = true;
    local_388.value.ptr.field_1.value.content.ptr = local_3d8.content.ptr;
    local_388.value.ptr.field_1.value.content.size_ = local_3d8.content.size_;
    local_388.value.ptr.field_1.value.content.disposer = local_3d8.content.disposer;
    local_3d8.content.ptr = (char *)0x0;
    local_3d8.content.size_ = 0;
    ExceptionOr<kj::String>::operator=((ExceptionOr<kj::String> *)output,&local_388);
    uVar4 = local_388.value.ptr.field_1.value.content.size_;
    uVar3 = local_388.value.ptr.field_1.value.content.ptr;
    if ((local_388.value.ptr.isSet == true) &&
       (local_388.value.ptr.field_1.value.content.ptr != (char *)0x0)) {
      local_388.value.ptr.field_1.value.content.ptr = (char *)0x0;
      local_388.value.ptr.field_1.value.content.size_ = 0;
      (**(local_388.value.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                (local_388.value.ptr.field_1.value.content.disposer,uVar3,1,uVar4,uVar4,0);
    }
    if (local_388.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_388.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    sVar2 = local_3d8.content.size_;
    pcVar1 = local_3d8.content.ptr;
    if (local_3d8.content.ptr != (char *)0x0) {
      local_3d8.content.ptr = (char *)0x0;
      local_3d8.content.size_ = 0;
      (**(local_3d8.content.disposer)->_vptr_ArrayDisposer)
                (local_3d8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
  }
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }